

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_General_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  OSTEI_HRR_Algorithm_Base *pOVar1;
  RRStepType step;
  ostream *poVar2;
  pointer am_00;
  string local_f0;
  char *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  QAMList local_b0;
  _Type local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  size_type local_78;
  char local_70 [16];
  undefined1 local_60 [48];
  
  pOVar1 = this->hrr_algo_;
  local_98 = *(_Type *)((am->qam)._M_elems + 2);
  uStack_90 = 0;
  std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_f0);
  local_80._M_p = local_70;
  local_88._0_4_ = local_98[0];
  local_88._4_4_ = local_98[1];
  if (local_d0 == local_c0) {
    local_70[8] = (undefined1)uStack_b8;
    local_70[9] = uStack_b8._1_1_;
    local_70[10] = uStack_b8._2_1_;
    local_70[0xb] = uStack_b8._3_1_;
    local_70[0xc] = uStack_b8._4_1_;
    local_70[0xd] = uStack_b8._5_1_;
    local_70[0xe] = uStack_b8._6_1_;
    local_70[0xf] = uStack_b8._7_1_;
  }
  else {
    local_80._M_p = local_d0;
  }
  local_78 = local_c8;
  local_c8 = 0;
  local_c0[0] = '\0';
  local_d0 = local_c0;
  step = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar1,(DAM *)local_88);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"ostei_general_hrr_");
  RRStepTypeToStr_abi_cxx11_(&local_f0,step);
  poVar2 = std::operator<<(poVar2,(string *)&local_f0);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(am->qam)._M_elems[0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(am->qam)._M_elems[1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(am->qam)._M_elems[2]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(am->qam)._M_elems[3]);
  std::operator<<(poVar2,", hCD, ");
  std::__cxx11::string::~string((string *)&local_f0);
  pOVar1 = this->hrr_algo_;
  QAM::QAM((QAM *)local_60,am);
  OSTEI_HRR_Algorithm_Base::GenerateAMReq(&local_b0,pOVar1,(QAM *)local_60,step);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  for (am_00 = local_b0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start;
      am_00 != local_b0.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_finish; am_00 = am_00 + 1) {
    HRRVarName_abi_cxx11_(&local_f0,am_00);
    poVar2 = std::operator<<(os,(string *)&local_f0);
    std::operator<<(poVar2,", ");
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_b0);
  HRRVarName_abi_cxx11_(&local_f0,am);
  poVar2 = std::operator<<(os,(string *)&local_f0);
  std::operator<<(poVar2,");\n");
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_General_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetKetRRStep({am[2], am[3]});
    os << indent4 << "ostei_general_hrr_" << RRStepTypeToStr(rrstep)
       << "(" << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", hCD, ";

    for(const auto & it : hrr_algo_.GenerateAMReq(am, rrstep))
        os << HRRVarName(it) << ", ";

    os << HRRVarName(am) << ");\n";
}